

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkUniversal::Update(ChLinkUniversal *this,double time,bool update_assets)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  ChMatrix33<double> Phi_pi2;
  ChMatrix33<double> Phi_pi1;
  ChFrame<double> frame2_abs;
  ChFrame<double> frame1_abs;
  ChMatrix33<double> local_210;
  ChMatrix33<double> local_1c8;
  ChMatrix33<double> *local_180;
  ChMatrix33<double> *local_178;
  double local_170;
  double local_168;
  undefined8 local_160;
  ulong local_158;
  ulong uStack_150;
  double local_148;
  undefined8 local_140;
  ChMatrix33<double> *local_138;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
  *local_130;
  ChFrame<double> local_128;
  ChFrame<double> local_a0;
  
  ChLink::UpdateTime(&this->super_ChLink,time);
  ChFrame<double>::operator>>
            (&local_a0,&this->m_frame1,(ChFrame<double> *)(this->super_ChLink).Body1);
  ChFrame<double>::operator>>
            (&local_128,&this->m_frame2,(ChFrame<double> *)(this->super_ChLink).Body2);
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
       = local_128.coord.pos.m_data[0] - local_a0.coord.pos.m_data[0];
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
       = local_128.coord.pos.m_data[1] - local_a0.coord.pos.m_data[1];
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
       = local_128.coord.pos.m_data[2] - local_a0.coord.pos.m_data[2];
  local_180 = &(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
               Amatrix;
  local_178 = &local_210;
  local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (this->m_frame1).coord.pos.m_data[2];
  auVar23._0_8_ =
       -local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar23._8_8_ = 0x8000000000000000;
  local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)vmovlpd_avx(auVar23);
  local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (this->m_frame1).coord.pos.m_data[1];
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (this->m_frame1).coord.pos.m_data[0];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar13 = vunpcklpd_avx(auVar14,auVar24);
  local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       -auVar13._0_8_;
  local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       -auVar13._8_8_;
  local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_1c8,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_180);
  local_138 = &(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
               Amatrix;
  local_180 = (ChMatrix33<double> *)0x0;
  local_168 = (this->m_frame2).coord.pos.m_data[2];
  auVar25._0_8_ = -local_168;
  auVar25._8_8_ = 0x8000000000000000;
  local_178 = (ChMatrix33<double> *)vmovlpd_avx(auVar25);
  local_170 = (this->m_frame2).coord.pos.m_data[1];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_170;
  local_160 = 0;
  local_148 = (this->m_frame2).coord.pos.m_data[0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_148;
  auVar13 = vunpcklpd_avx(auVar15,auVar26);
  local_158 = auVar13._0_8_ ^ 0x8000000000000000;
  uStack_150 = auVar13._8_8_ ^ 0x8000000000000000;
  local_140 = 0;
  local_130 = (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
               *)&local_180;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_210,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_138);
  (this->m_cnstr_x).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = -1.0;
  (this->m_cnstr_x).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = 1.0;
  (this->m_cnstr_x).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_cnstr_x).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_cnstr_x).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_cnstr_x).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_cnstr_x).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] =
       local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar27._0_8_ =
       -local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar27._8_4_ = 0;
  auVar27._12_4_ = 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar27);
  (this->m_cnstr_x).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = dVar1;
  (this->m_cnstr_x).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] =
       local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar28._0_8_ =
       -local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar28._8_4_ = 0;
  auVar28._12_4_ = 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar28);
  (this->m_cnstr_x).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = dVar1;
  (this->m_cnstr_x).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] =
       local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar29._0_8_ =
       -local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar29._8_4_ = 0;
  auVar29._12_4_ = 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar29);
  (this->m_cnstr_x).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = dVar1;
  (this->m_cnstr_y).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_cnstr_y).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_cnstr_y).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = -1.0;
  (this->m_cnstr_y).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = 1.0;
  (this->m_cnstr_y).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_cnstr_y).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_cnstr_y).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] =
       local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar30._0_8_ =
       -local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar30._8_4_ = 0;
  auVar30._12_4_ = 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar30);
  (this->m_cnstr_y).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = dVar1;
  (this->m_cnstr_y).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] =
       local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar31._0_8_ =
       -local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar31._8_4_ = 0;
  auVar31._12_4_ = 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar31);
  (this->m_cnstr_y).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = dVar1;
  (this->m_cnstr_y).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] =
       local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar32._0_8_ =
       -local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar32._8_4_ = 0;
  auVar32._12_4_ = 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar32);
  (this->m_cnstr_y).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = dVar1;
  (this->m_cnstr_z).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_cnstr_z).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_cnstr_z).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_cnstr_z).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_cnstr_z).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = -1.0;
  (this->m_cnstr_z).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 1.0;
  (this->m_cnstr_z).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] =
       local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar16._0_8_ =
       -local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar16._8_4_ = 0;
  auVar16._12_4_ = 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar16);
  (this->m_cnstr_z).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = dVar1;
  (this->m_cnstr_z).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] =
       local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar17._0_8_ =
       -local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar17._8_4_ = 0;
  auVar17._12_4_ = 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar17);
  (this->m_cnstr_z).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = dVar1;
  (this->m_cnstr_z).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] =
       local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar18._0_8_ =
       -local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar18._8_4_ = 0;
  auVar18._12_4_ = 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar18);
  (this->m_cnstr_z).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = dVar1;
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar13 = vfmadd231sd_fma(auVar19,auVar33,auVar39);
  auVar13 = vfmadd231sd_fma(auVar13,auVar36,auVar43);
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
       = auVar13._0_8_;
  local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                Amatrix;
  local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&this->m_u1_tilde;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_1c8,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_210);
  local_180 = &(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
               Amatrix;
  local_178 = &this->m_v2_tilde;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_210,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_180);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar13 = vfmadd231sd_fma(auVar20,auVar37,auVar13);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar13 = vfmadd231sd_fma(auVar13,auVar40,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar2 = vfmadd231sd_fma(auVar34,auVar37,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar2 = vfmadd231sd_fma(auVar2,auVar40,auVar4);
  auVar13 = vunpcklpd_avx(auVar13,auVar2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar2 = vfmadd231sd_fma(auVar35,auVar37,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_1c8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar3 = vfmadd231sd_fma(auVar2,auVar40,auVar6);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar2 = vfmadd231sd_fma(auVar38,auVar44,auVar7);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar2 = vfmadd231sd_fma(auVar2,auVar45,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar4 = vfmadd231sd_fma(auVar41,auVar44,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar4 = vfmadd231sd_fma(auVar4,auVar45,auVar10);
  auVar2 = vunpcklpd_avx(auVar2,auVar4);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar4 = vfmadd231sd_fma(auVar42,auVar44,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       local_210.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar4 = vfmadd231sd_fma(auVar4,auVar45,auVar12);
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = -auVar13._0_8_;
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = -auVar13._8_8_;
  auVar21._0_8_ = auVar3._0_8_ ^ 0x8000000000000000;
  auVar21._8_8_ = auVar3._8_8_ ^ 0x8000000000000000;
  dVar1 = (double)vmovlpd_avx(auVar21);
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = dVar1;
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = -auVar2._0_8_;
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = -auVar2._8_8_;
  auVar22._0_8_ = auVar4._0_8_ ^ 0x8000000000000000;
  auVar22._8_8_ = auVar4._8_8_ ^ 0x8000000000000000;
  dVar1 = (double)vmovlpd_avx(auVar22);
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = dVar1;
  return;
}

Assistant:

void ChLinkUniversal::Update(double time, bool update_assets) {
    // Inherit time changes of parent class
    ChLink::UpdateTime(time);

    // Express the joint frames in absolute frame
    ChFrame<> frame1_abs = m_frame1 >> *Body1;
    ChFrame<> frame2_abs = m_frame2 >> *Body2;

    // Calculate violations of the spherical constraints
    m_C(0) = frame2_abs.coord.pos.x() - frame1_abs.coord.pos.x();
    m_C(1) = frame2_abs.coord.pos.y() - frame1_abs.coord.pos.y();
    m_C(2) = frame2_abs.coord.pos.z() - frame1_abs.coord.pos.z();

    // Compute Jacobian of the spherical constraints
    //    pos2_abs - pos1_abs = 0
    {
        ChMatrix33<> Phi_pi1 = Body1->GetA() * ChStarMatrix33<>(m_frame1.coord.pos);
        ChMatrix33<> Phi_pi2 = Body2->GetA() * ChStarMatrix33<>(m_frame2.coord.pos);

        m_cnstr_x.Get_Cq_a()(0) = -1;
        m_cnstr_x.Get_Cq_b()(0) = +1;
        m_cnstr_x.Get_Cq_a()(1) = 0;
        m_cnstr_x.Get_Cq_b()(1) = 0;
        m_cnstr_x.Get_Cq_a()(2) = 0;
        m_cnstr_x.Get_Cq_b()(2) = 0;
        m_cnstr_x.Get_Cq_a()(3) = Phi_pi1(0, 0);
        m_cnstr_x.Get_Cq_b()(3) = -Phi_pi2(0, 0);
        m_cnstr_x.Get_Cq_a()(4) = Phi_pi1(0, 1);
        m_cnstr_x.Get_Cq_b()(4) = -Phi_pi2(0, 1);
        m_cnstr_x.Get_Cq_a()(5) = Phi_pi1(0, 2);
        m_cnstr_x.Get_Cq_b()(5) = -Phi_pi2(0, 2);

        m_cnstr_y.Get_Cq_a()(0) = 0;
        m_cnstr_y.Get_Cq_b()(0) = 0;
        m_cnstr_y.Get_Cq_a()(1) = -1;
        m_cnstr_y.Get_Cq_b()(1) = +1;
        m_cnstr_y.Get_Cq_a()(2) = 0;
        m_cnstr_y.Get_Cq_b()(2) = 0;
        m_cnstr_y.Get_Cq_a()(3) = Phi_pi1(1, 0);
        m_cnstr_y.Get_Cq_b()(3) = -Phi_pi2(1, 0);
        m_cnstr_y.Get_Cq_a()(4) = Phi_pi1(1, 1);
        m_cnstr_y.Get_Cq_b()(4) = -Phi_pi2(1, 1);
        m_cnstr_y.Get_Cq_a()(5) = Phi_pi1(1, 2);
        m_cnstr_y.Get_Cq_b()(5) = -Phi_pi2(1, 2);

        m_cnstr_z.Get_Cq_a()(0) = 0;
        m_cnstr_z.Get_Cq_b()(0) = 0;
        m_cnstr_z.Get_Cq_a()(1) = 0;
        m_cnstr_z.Get_Cq_b()(1) = 0;
        m_cnstr_z.Get_Cq_a()(2) = -1;
        m_cnstr_z.Get_Cq_b()(2) = +1;
        m_cnstr_z.Get_Cq_a()(3) = Phi_pi1(2, 0);
        m_cnstr_z.Get_Cq_b()(3) = -Phi_pi2(2, 0);
        m_cnstr_z.Get_Cq_a()(4) = Phi_pi1(2, 1);
        m_cnstr_z.Get_Cq_b()(4) = -Phi_pi2(2, 1);
        m_cnstr_z.Get_Cq_a()(5) = Phi_pi1(2, 2);
        m_cnstr_z.Get_Cq_b()(5) = -Phi_pi2(2, 2);
    }

    // Calculate violation of the dot constraint
    ChVector<> u1 = frame1_abs.GetA().Get_A_Xaxis();
    ChVector<> v2 = frame2_abs.GetA().Get_A_Yaxis();

    m_C(3) = Vdot(u1, v2);

    // Compute Jacobian of the dot constraint
    //    dot(u1_abs, v2_abs) = 0
    {
        ChMatrix33<> mat1 = Body1->GetA() * m_u1_tilde;
        ChMatrix33<> mat2 = Body2->GetA() * m_v2_tilde;
        ChVector<> Phi_pi1 = mat1.transpose() * v2;
        ChVector<> Phi_pi2 = mat2.transpose() * u1;

        m_cnstr_dot.Get_Cq_a()(0) = 0;
        m_cnstr_dot.Get_Cq_a()(1) = 0;
        m_cnstr_dot.Get_Cq_a()(2) = 0;
        m_cnstr_dot.Get_Cq_a()(3) = -Phi_pi1.x();
        m_cnstr_dot.Get_Cq_a()(4) = -Phi_pi1.y();
        m_cnstr_dot.Get_Cq_a()(5) = -Phi_pi1.z();

        m_cnstr_dot.Get_Cq_b()(0) = 0;
        m_cnstr_dot.Get_Cq_b()(1) = 0;
        m_cnstr_dot.Get_Cq_b()(2) = 0;
        m_cnstr_dot.Get_Cq_b()(3) = -Phi_pi2.x();
        m_cnstr_dot.Get_Cq_b()(4) = -Phi_pi2.y();
        m_cnstr_dot.Get_Cq_b()(5) = -Phi_pi2.z();
    }
}